

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convex_hull.cpp
# Opt level: O2

vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
* ear::convex_hull(vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   *__return_storage_ptr__,
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *positions,double tolerance)

{
  unsigned_long uVar1;
  pointer pMVar2;
  pointer psVar3;
  pointer paVar4;
  pointer pMVar5;
  long lVar6;
  pointer pMVar7;
  Matrix<double,_3,_1,_0,_3,_1> *pos;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar8;
  long lVar9;
  pointer pMVar10;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar11;
  pointer pMVar12;
  ulong uVar13;
  pointer pMVar14;
  pointer pMVar15;
  Matrix<double,_3,_1,_0,_3,_1> *pos_1;
  long lVar16;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range1;
  ulong uVar17;
  ResScalar RVar18;
  ResScalar RVar19;
  ResScalar RVar20;
  undefined1 auVar21 [16];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_facet_normals;
  Vec normal;
  pointer local_e8;
  pointer pMStack_e0;
  double local_d8;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> hull_tris
  ;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_tri_normals;
  Vec inside_point;
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&inside_point,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&normal);
  pMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            (positions->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                (positions->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pMVar8 != pMVar11;
      pMVar8 = pMVar8 + 0x18) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&inside_point,pMVar8);
  }
  lVar6 = ((long)(positions->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(positions->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  auVar21._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar21._0_8_ = lVar6;
  auVar21._12_4_ = 0x45300000;
  normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (auVar21._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&inside_point,(Scalar *)&normal);
  hull_tris.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hull_tri_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hull_tris.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hull_tris.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hull_tri_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hull_tri_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar7 = (positions->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (positions->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pMVar2 = (pointer)0x0;
  while (pMVar14 = pMVar2, pMVar14 < (pointer)(((long)pMVar12 - (long)pMVar7) / 0x18)) {
    pMVar2 = (pointer)((long)(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                             .m_storage.m_data.array + 1);
    pMVar5 = pMVar2;
    while (pMVar15 = pMVar5, pMVar15 < (pointer)(((long)pMVar12 - (long)pMVar7) / 0x18)) {
      pMVar5 = (pointer)((long)(pMVar15->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + 1);
      for (pMVar10 = pMVar5; pMVar10 < (pointer)(((long)pMVar12 - (long)pMVar7) / 0x18);
          pMVar10 = (pointer)((long)(pMVar10->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array + 1)) {
        hull_facet_normals.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pMVar7 + (long)pMVar15;
        hull_facet_normals.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMVar7 + (long)pMVar14;
        local_e8 = pMVar7 + (long)pMVar10;
        pMStack_e0 = hull_facet_normals.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
        ::
        cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((type *)&normal,&hull_facet_normals,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&local_e8);
        _assert_impl(tolerance <
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2] *
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2] +
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[1] *
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[1] +
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[0] *
                     normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[0],"collinear points in convex hull");
        Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&normal);
        hull_facet_normals.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (positions->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start + (long)pMVar14;
        hull_facet_normals.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = &inside_point;
        RVar18 = Eigen::internal::
                 dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
                 ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&normal,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&hull_facet_normals);
        if (tolerance <= ABS(RVar18)) {
          pMVar12 = (positions->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (pMVar7 = (positions->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar12;
              pMVar7 = pMVar7 + 1) {
            hull_facet_normals.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (positions->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)pMVar14;
            hull_facet_normals.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start = pMVar7;
            RVar19 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&normal,
                           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)&hull_facet_normals);
            if (RVar18 <= 0.0) {
              if (tolerance <= RVar19) goto LAB_00167d3b;
            }
            else if (RVar19 <= -tolerance) goto LAB_00167d3b;
          }
          hull_facet_normals.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pMVar14;
          hull_facet_normals.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pMVar15;
          hull_facet_normals.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar10;
          std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>::
          emplace_back<std::array<unsigned_long,3ul>>
                    ((vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>
                      *)&hull_tris,(array<unsigned_long,_3UL> *)&hull_facet_normals);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::push_back(&hull_tri_normals,(value_type *)&normal);
        }
LAB_00167d3b:
        pMVar7 = (positions->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar12 = (positions->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hull_facet_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hull_facet_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hull_facet_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 0;
  uVar13 = 0;
  do {
    if ((ulong)(((long)hull_tris.
                       super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)hull_tris.
                      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar13) {
      std::
      _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~_Vector_base(&hull_facet_normals.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     );
      std::
      _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~_Vector_base(&hull_tri_normals.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     );
      std::
      _Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ::~_Vector_base(&hull_tris.
                       super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                     );
      return __return_storage_ptr__;
    }
    uVar1 = hull_tris.
            super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems[0];
    pMVar2 = (positions->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (hull_tri_normals.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar13);
    lVar16 = 0;
    lVar9 = 0;
    for (uVar17 = 0;
        paVar4 = hull_tris.
                 super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        psVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3) / 0x30);
        uVar17 = uVar17 + 1) {
      pMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                ((long)((hull_facet_normals.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar16);
      normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           = (double)((positions->
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)((long)&(psVar3->_M_t)._M_impl.super__Rb_tree_header +
                                       lVar9 + 0x10U) + 0x20));
      normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = (double)(pMVar2 + uVar1);
      RVar20 = Eigen::internal::
               dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)&normal,pMVar11);
      if ((ABS(RVar20) < tolerance) &&
         (Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                    (pMVar11,pMVar8),
         paVar4 = hull_tris.
                  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
         local_d8 * local_d8 +
         (double)pMStack_e0 * (double)pMStack_e0 + (double)local_e8 * (double)local_e8 < tolerance))
      {
        for (lVar16 = 0; lVar16 != 0x18; lVar16 = lVar16 + 8) {
          normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] = (double)CONCAT44(normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                 .m_storage.m_data.array[0]._4_4_,
                                 *(undefined4 *)((long)paVar4->_M_elems + lVar16 + lVar6));
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)((long)&(((__return_storage_ptr__->
                                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                field_0x0 + lVar9),(int *)&normal);
        }
        goto LAB_00167f24;
      }
      lVar9 = lVar9 + 0x30;
      lVar16 = lVar16 + 0x18;
    }
    normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         (double)((ulong)normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1] & 0xffffffff00000000);
    normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         0.0;
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
      local_e8 = (pointer)CONCAT44(local_e8._4_4_,
                                   *(undefined4 *)((long)paVar4->_M_elems + lVar9 + lVar6));
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &normal,(int *)&local_e8);
    }
    std::
    vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
    ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
              ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                *)__return_storage_ptr__,(set<int,_std::less<int>,_std::allocator<int>_> *)&normal);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back(&hull_facet_normals,(value_type *)pMVar8);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &normal);
LAB_00167f24:
    uVar13 = uVar13 + 1;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

std::vector<Facet> convex_hull(const std::vector<Eigen::Vector3d> &positions,
                                 double tolerance) {
    using Vec = Eigen::Vector3d;
    using Tri = std::array<size_t, 3>;

    // the mean point, guaranteed to be inside the convex hull
    Vec inside_point = Vec::Zero();
    for (auto &pos : positions) inside_point += pos;
    inside_point /= (double)positions.size();

    // find all triangles on the convex hull:
    // - iterate through all possible triangles
    // - find the triangle normal, checking for collinearity
    // - it's on the convex hull if:
    //    - the inside point is not on the plane of the triangle
    //    - all points are on the same side of the plane of the triangle as the
    //    inside point
    std::vector<Tri> hull_tris;
    std::vector<Vec> hull_tri_normals;

    for (size_t i = 0; i < positions.size(); i++)
      for (size_t j = i + 1; j < positions.size(); j++)
        for (size_t k = j + 1; k < positions.size(); k++) {
          Vec normal =
              (positions[j] - positions[i]).cross(positions[k] - positions[i]);
          ear_assert(normal.squaredNorm() > tolerance,
                     "collinear points in convex hull");
          normal.normalize();  // XXX: not really required, but helps make
                               // tolerances consistent

          double dot_inside = normal.dot(inside_point - positions[i]);

          if (std::abs(dot_inside) < tolerance)
            continue;  // tri coplanar with inside point

          bool points_on_same_side_as_inside = true;
          for (auto &pos : positions) {
            double dot_point = normal.dot(pos - positions[i]);

            // check if signs are equal, with tolerance
            if (!(dot_inside > 0 ? dot_point > -tolerance
                                 : dot_point < tolerance)) {
              points_on_same_side_as_inside = false;
              break;
            }
          }

          if (points_on_same_side_as_inside) {
            hull_tris.push_back({i, j, k});
            hull_tri_normals.push_back(normal);
          }
        }

    // merge coplanar triangles into facets
    std::vector<Facet> hull_facets;
    std::vector<Vec> hull_facet_normals;

    for (size_t tri_i = 0; tri_i < hull_tris.size(); tri_i++) {
      const Vec &tri_point = positions[hull_tris[tri_i][0]];
      const Vec &tri_norm = hull_tri_normals[tri_i];

      // check each facet to see if this triangle is on the same plane.
      // if it is, add the points to the facet. if no facet is found, make a
      // new facet.
      bool found_facet = false;
      for (size_t facet_i = 0; facet_i < hull_facets.size(); facet_i++) {
        const Vec &facet_norm = hull_facet_normals[facet_i];
        const Vec &facet_point = positions[*hull_facets[facet_i].begin()];

        // they are on the same plane if the line between the test points is
        // not along the normal, and if the normals point in the same or
        // opposite direction. alternatively, we could just test all tri
        // vertices.
        if (std::abs((tri_point - facet_point).dot(facet_norm)) < tolerance &&
            facet_norm.cross(tri_norm).squaredNorm() < tolerance) {
          for (size_t corner_idx : hull_tris[tri_i]) {
            hull_facets[facet_i].insert((Facet::value_type)corner_idx);
          }

          found_facet = true;
          break;
        }
      }

      if (!found_facet) {
        Facet f;
        for (size_t corner_idx : hull_tris[tri_i])
          f.insert((Facet::value_type)corner_idx);
        hull_facets.push_back(std::move(f));
        hull_facet_normals.push_back(tri_norm);
      }
    }

    return hull_facets;
  }